

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DProjLod3Offset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  undefined1 local_50 [32];
  tcu local_30 [8];
  float afStack_28 [2];
  
  fVar1 = c->in[0].m_data[2];
  texture2DOffset((ShaderEvalContext *)local_50,c->in[0].m_data[0] / fVar1,
                  c->in[0].m_data[1] / fVar1,c->in[1].m_data[0],(IVec2 *)c);
  tcu::operator*((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+(local_30,(Vector<float,_4> *)(local_50 + 0x10),&p->bias);
  *(tcu (*) [8])(c->color).m_data = local_30;
  *(float (*) [2])((c->color).m_data + 2) = afStack_28;
  return;
}

Assistant:

static void		evalTexture2DProjLod3Offset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), c.in[1].x(), p.offset.swizzle(0,1))*p.scale + p.bias; }